

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

VoidPromiseAndPipeline * __thiscall
capnp::LocalCallContext::directTailCall
          (VoidPromiseAndPipeline *__return_storage_ptr__,LocalCallContext *this,
          Own<capnp::RequestHook> *request)

{
  long *plVar1;
  PipelineHook *pPVar2;
  long lVar3;
  undefined8 uVar4;
  TransformPromiseNode<kj::_::Void,_capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:156:37),_kj::_::PropagateException>
  *pTVar5;
  TransformPromiseNode<kj::_::Void,_capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:156:37),_kj::_::PropagateException>
  *extraout_RDX;
  Own<kj::_::TransformPromiseNode<kj::_::Void,_capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:156:37),_kj::_::PropagateException>_>
  OVar6;
  RemotePromise<capnp::AnyPointer> promise;
  Fault local_68;
  long *local_60;
  Disposer *local_58;
  PipelineHook *local_50;
  long local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  LocalCallContext *local_30;
  Own<kj::_::PromiseNode> local_28;
  
  if ((this->response).ptr.isSet != true) {
    (**request->ptr->_vptr_RequestHook)(&local_68);
    local_30 = this;
    OVar6 = kj::
            heap<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnp::AnyPointer>,capnp::LocalCallContext::directTailCall(kj::Own<capnp::RequestHook>&&)::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::LocalCallContext::directTailCall(kj::Own<capnp::RequestHook>&&)::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,kj::_::PropagateException>
                      (&local_28,(anon_class_8_1_8991fb9c_for_func *)&local_68,
                       (PropagateException *)&local_30);
    uVar4 = uStack_40;
    lVar3 = local_48;
    pTVar5 = OVar6.ptr;
    *(undefined4 *)&(__return_storage_ptr__->promise).super_PromiseBase.node.disposer =
         local_28.disposer._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->promise).super_PromiseBase.node.disposer + 4) =
         local_28.disposer._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->promise).super_PromiseBase.node.ptr =
         local_28.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->promise).super_PromiseBase.node.ptr + 4) =
         local_28.ptr._4_4_;
    (__return_storage_ptr__->pipeline).disposer = local_58;
    (__return_storage_ptr__->pipeline).ptr = local_50;
    local_50 = (PipelineHook *)0x0;
    if (local_48 != 0) {
      local_48 = 0;
      uStack_40 = 0;
      (**(code **)*local_38)(local_38,lVar3,8,uVar4,uVar4,0);
      pTVar5 = extraout_RDX;
    }
    pPVar2 = local_50;
    if (local_50 != (PipelineHook *)0x0) {
      local_50 = (PipelineHook *)0x0;
      (**local_58->_vptr_Disposer)
                (local_58,(long)pPVar2 + *(long *)(*(long *)pPVar2 + -0x10),pTVar5);
    }
    plVar1 = local_60;
    if (local_60 != (long *)0x0) {
      local_60 = (long *)0x0;
      (**(code **)((local_68.exception)->ownFile).content.ptr)
                (local_68.exception,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
            (&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0x98,FAILED,"response == nullptr",
             "\"Can\'t call tailCall() after initializing the results struct.\"",
             (char (*) [61])"Can\'t call tailCall() after initializing the results struct.");
  kj::_::Debug::Fault::fatal(&local_68);
}

Assistant:

ClientHook::VoidPromiseAndPipeline directTailCall(kj::Own<RequestHook>&& request) override {
    KJ_REQUIRE(response == nullptr, "Can't call tailCall() after initializing the results struct.");

    auto promise = request->send();

    auto voidPromise = promise.then([this](Response<AnyPointer>&& tailResponse) {
      response = kj::mv(tailResponse);
    });

    return { kj::mv(voidPromise), PipelineHook::from(kj::mv(promise)) };
  }